

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O0

int __thiscall cinatra::coro_http_server::listen(coro_http_server *this,int __fd,int __n)

{
  bool bVar1;
  port_type pVar2;
  null_logger_t *pnVar3;
  error_code *this_00;
  error_code eVar4;
  error_code eVar5;
  endpoint_type end_point;
  error_code ignore_ec;
  endpoint_type endpoint;
  iterator it_end;
  iterator it;
  resolver resolver;
  query query;
  error_code ec;
  basic_resolver_entry<asio::ip::tcp> *in_stack_fffffffffffffbb8;
  basic_resolver_query<asio::ip::tcp> *in_stack_fffffffffffffbc0;
  basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *in_stack_fffffffffffffbc8;
  error_code *in_stack_fffffffffffffbd0;
  error_code *in_stack_fffffffffffffbd8;
  query *in_stack_fffffffffffffbe0;
  basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *in_stack_fffffffffffffbe8;
  undefined8 in_stack_fffffffffffffbf8;
  flags resolve_flags;
  string *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc0c;
  basic_resolver_query<asio::ip::tcp> *in_stack_fffffffffffffc10;
  undefined1 local_280 [56];
  int local_248;
  socklen_t local_238;
  error_category *local_230;
  boolean<1,_2> local_224 [11];
  int local_1f8;
  int local_1e4;
  undefined1 local_1e0 [28];
  undefined4 local_1c4;
  error_code local_28;
  coro_http_server *local_18;
  error_code local_10;
  
  resolve_flags = (flags)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
  local_18 = this;
  pnVar3 = null_logger_t::operator<<
                     ((null_logger_t *)&NULL_LOGGER,(char (*) [17])"begin to listen ");
  null_logger_t::operator<<(pnVar3,&this->port_);
  std::error_code::error_code((error_code *)in_stack_fffffffffffffbc0);
  std::__cxx11::to_string(in_stack_fffffffffffffc0c);
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (in_stack_fffffffffffffc10,
             (string *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
             in_stack_fffffffffffffc00,resolve_flags);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbc0);
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::get_executor
            (in_stack_fffffffffffffbc8);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)in_stack_fffffffffffffbd0,
             (executor_type *)in_stack_fffffffffffffbc8);
  asio::any_io_executor::~any_io_executor((any_io_executor *)0x257389);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)in_stack_fffffffffffffbe8,
             in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffbc0,
             (basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffbb8);
  asio::ip::basic_resolver_results<asio::ip::tcp>::~basic_resolver_results
            ((basic_resolver_results<asio::ip::tcp> *)0x2573d4);
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffbc0);
  bVar1 = std::error_code::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    bVar1 = asio::ip::operator==
                      ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffbc0,
                       (basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffbb8);
    if (!bVar1) {
      asio::ip::basic_resolver_iterator<asio::ip::tcp>::operator->
                ((basic_resolver_iterator<asio::ip::tcp> *)0x25764b);
      asio::ip::basic_resolver_entry<asio::ip::tcp>::endpoint(in_stack_fffffffffffffbb8);
      local_1e4 = (int)asio::ip::basic_endpoint<asio::ip::tcp>::protocol
                                 (&in_stack_fffffffffffffbb8->endpoint_);
      local_1f8 = asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::open
                            (&this->acceptor_,(char *)&local_1e4,(int)&local_28);
      bVar1 = std::error_code::operator_cast_to_bool(&local_28);
      if (bVar1) {
        cerr_logger_t::operator<<
                  ((cerr_logger_t *)in_stack_fffffffffffffbc0,
                   (char (*) [21])in_stack_fffffffffffffbb8);
        cerr_logger_t::operator<<
                  ((cerr_logger_t *)in_stack_fffffffffffffbc0,
                   (char (*) [9])in_stack_fffffffffffffbb8);
        std::error_code::message_abi_cxx11_(in_stack_fffffffffffffbd8);
        cerr_logger_t::operator<<
                  ((cerr_logger_t *)in_stack_fffffffffffffbc0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbb8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbc0);
        cerr_logger_t::~cerr_logger_t((cerr_logger_t *)0x25777a);
        local_10._M_value = local_28._M_value;
        local_10._4_4_ = local_28._4_4_;
        local_10._M_cat = local_28._M_cat;
      }
      else {
        asio::detail::socket_option::boolean<1,_2>::boolean(local_224,true);
        eVar5 = asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
                set_option<asio::detail::socket_option::boolean<1,2>>
                          (in_stack_fffffffffffffbe8,(boolean<1,_2> *)in_stack_fffffffffffffbe0,
                           in_stack_fffffffffffffbd8);
        local_230 = eVar5._M_cat;
        local_238 = eVar5._M_value;
        local_248 = asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::bind
                              (&this->acceptor_,(int)local_1e0,(sockaddr *)&local_28,local_238);
        bVar1 = std::error_code::operator_cast_to_bool(&local_28);
        if (bVar1) {
          cerr_logger_t::operator<<
                    ((cerr_logger_t *)in_stack_fffffffffffffbc0,
                     (char (*) [12])in_stack_fffffffffffffbb8);
          cerr_logger_t::operator<<
                    ((cerr_logger_t *)in_stack_fffffffffffffbc0,
                     (unsigned_short *)in_stack_fffffffffffffbb8);
          cerr_logger_t::operator<<
                    ((cerr_logger_t *)in_stack_fffffffffffffbc0,
                     (char (*) [9])in_stack_fffffffffffffbb8);
          std::error_code::message_abi_cxx11_(in_stack_fffffffffffffbd8);
          cerr_logger_t::operator<<
                    ((cerr_logger_t *)in_stack_fffffffffffffbc0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffbb8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffbc0);
          cerr_logger_t::~cerr_logger_t((cerr_logger_t *)0x257974);
          std::error_code::error_code((error_code *)in_stack_fffffffffffffbc0);
          asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::cancel
                    ((basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)
                     in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
          asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::close
                    (&this->acceptor_,(int)local_280);
          local_10._M_value = local_28._M_value;
          local_10._4_4_ = local_28._4_4_;
          local_10._M_cat = local_28._M_cat;
        }
        else {
          asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::listen
                    (&this->acceptor_,0x1000,(int)&local_28);
          bVar1 = std::error_code::operator_cast_to_bool(&local_28);
          if (bVar1) {
            cerr_logger_t::operator<<
                      ((cerr_logger_t *)in_stack_fffffffffffffbc0,
                       (char (*) [26])in_stack_fffffffffffffbb8);
            cerr_logger_t::operator<<
                      ((cerr_logger_t *)in_stack_fffffffffffffbc0,
                       (unsigned_short *)in_stack_fffffffffffffbb8);
            cerr_logger_t::operator<<
                      ((cerr_logger_t *)in_stack_fffffffffffffbc0,
                       (char (*) [16])in_stack_fffffffffffffbb8);
            std::error_code::message_abi_cxx11_(in_stack_fffffffffffffbd8);
            cerr_logger_t::operator<<
                      ((cerr_logger_t *)in_stack_fffffffffffffbc0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffbb8);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffbc0);
            cerr_logger_t::~cerr_logger_t((cerr_logger_t *)0x257b60);
            local_10._M_value = local_28._M_value;
            local_10._4_4_ = local_28._4_4_;
            local_10._M_cat = local_28._M_cat;
          }
          else {
            asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::local_endpoint
                      ((basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)
                       in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
            bVar1 = std::error_code::operator_cast_to_bool(&local_28);
            if (bVar1) {
              cerr_logger_t::operator<<
                        ((cerr_logger_t *)in_stack_fffffffffffffbc0,
                         (char (*) [26])in_stack_fffffffffffffbb8);
              this_00 = (error_code *)
                        cerr_logger_t::operator<<
                                  ((cerr_logger_t *)in_stack_fffffffffffffbc0,
                                   (unsigned_short *)in_stack_fffffffffffffbb8);
              cerr_logger_t::operator<<
                        ((cerr_logger_t *)in_stack_fffffffffffffbc0,
                         (char (*) [9])in_stack_fffffffffffffbb8);
              std::error_code::message_abi_cxx11_(this_00);
              cerr_logger_t::operator<<
                        ((cerr_logger_t *)in_stack_fffffffffffffbc0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffbb8);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffbc0);
              cerr_logger_t::~cerr_logger_t((cerr_logger_t *)0x257ca7);
              local_10._M_value = local_28._M_value;
              local_10._4_4_ = local_28._4_4_;
              local_10._M_cat = local_28._M_cat;
            }
            else {
              pVar2 = asio::ip::basic_endpoint<asio::ip::tcp>::port
                                ((basic_endpoint<asio::ip::tcp> *)0x257d2d);
              this->port_ = pVar2;
              pnVar3 = null_logger_t::operator<<
                                 ((null_logger_t *)&NULL_LOGGER,(char (*) [13])"listen port ");
              in_stack_fffffffffffffbc0 =
                   (basic_resolver_query<asio::ip::tcp> *)
                   null_logger_t::operator<<(pnVar3,&this->port_);
              null_logger_t::operator<<
                        ((null_logger_t *)in_stack_fffffffffffffbc0,(char (*) [14])" successfully");
              std::error_code::error_code((error_code *)in_stack_fffffffffffffbc0);
            }
          }
        }
      }
      goto LAB_00257d9e;
    }
  }
  cerr_logger_t::operator<<
            ((cerr_logger_t *)in_stack_fffffffffffffbc0,(char (*) [14])in_stack_fffffffffffffbb8);
  cerr_logger_t::operator<<
            ((cerr_logger_t *)in_stack_fffffffffffffbc0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbb8);
  cerr_logger_t::operator<<
            ((cerr_logger_t *)in_stack_fffffffffffffbc0,(char (*) [9])in_stack_fffffffffffffbb8);
  std::error_code::message_abi_cxx11_(in_stack_fffffffffffffbd8);
  cerr_logger_t::operator<<
            ((cerr_logger_t *)in_stack_fffffffffffffbc0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbc0);
  cerr_logger_t::~cerr_logger_t((cerr_logger_t *)0x2574c9);
  bVar1 = std::error_code::operator_cast_to_bool(&local_28);
  if (bVar1) {
    local_10._M_value = local_28._M_value;
    local_10._4_4_ = local_28._4_4_;
    local_10._M_cat = local_28._M_cat;
  }
  else {
    eVar4 = std::make_error_code(0);
    local_10._M_cat = eVar4._M_cat;
    local_10._M_value = eVar4._M_value;
  }
LAB_00257d9e:
  local_1c4 = 1;
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::~basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)0x257dab);
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::~basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)0x257db8);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::~basic_resolver
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)in_stack_fffffffffffffbc0);
  asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(in_stack_fffffffffffffbc0);
  return local_10._M_value;
}

Assistant:

std::error_code listen() {
    CINATRA_LOG_INFO << "begin to listen " << port_;
    using asio::ip::tcp;
    asio::error_code ec;

    asio::ip::tcp::resolver::query query(address_, std::to_string(port_));
    asio::ip::tcp::resolver resolver(acceptor_.get_executor());
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query, ec);

    asio::ip::tcp::resolver::iterator it_end;
    if (ec || it == it_end) {
      CINATRA_LOG_ERROR << "bad address: " << address_
                        << " error: " << ec.message();
      if (ec) {
        return ec;
      }
      return std::make_error_code(std::errc::address_not_available);
    }

    auto endpoint = it->endpoint();
    acceptor_.open(endpoint.protocol(), ec);
    if (ec) {
      CINATRA_LOG_ERROR << "acceptor open failed"
                        << " error: " << ec.message();
      return ec;
    }
#ifdef __GNUC__
    acceptor_.set_option(tcp::acceptor::reuse_address(true), ec);
#endif
    acceptor_.bind(endpoint, ec);
    if (ec) {
      CINATRA_LOG_ERROR << "bind port: " << port_ << " error: " << ec.message();
      std::error_code ignore_ec;
      acceptor_.cancel(ignore_ec);
      acceptor_.close(ignore_ec);
      return ec;
    }
#ifdef _MSC_VER
    acceptor_.set_option(tcp::acceptor::reuse_address(true));
#endif
    acceptor_.listen(asio::socket_base::max_listen_connections, ec);
    if (ec) {
      CINATRA_LOG_ERROR << "get local endpoint port: " << port_
                        << " listen error: " << ec.message();
      return ec;
    }

    auto end_point = acceptor_.local_endpoint(ec);
    if (ec) {
      CINATRA_LOG_ERROR << "get local endpoint port: " << port_
                        << " error: " << ec.message();
      return ec;
    }
    port_ = end_point.port();

    CINATRA_LOG_INFO << "listen port " << port_ << " successfully";
    return {};
  }